

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

qint64 __thiscall
QCborValueConstRef::concreteIntegral
          (QCborValueConstRef *this,QCborValueConstRef self,qint64 defaultValue)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = *(double *)(&(this[3].d)->super_QSharedData + (long)self.d * 4);
  iVar1 = (int)(&(this[3].d)->usedData)[(long)self.d * 2];
  dVar3 = dVar2;
  if ((iVar1 != 0) && (dVar3 = (double)self.i, iVar1 == 0x202)) {
    return (long)dVar2;
  }
  return (qint64)dVar3;
}

Assistant:

qint64 QCborValueConstRef::concreteIntegral(QCborValueConstRef self, qint64 defaultValue) noexcept
{
    QtCbor::Element e = self.d->elements.at(self.i);
    QCborValue::Type t = e.type;
    if (t == QCborValue::Double)
        return e.fpvalue();
    if (t != QCborValue::Integer)
        return defaultValue;
    return e.value;
}